

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_sub(sexp ctx,sexp dst,sexp a,sexp b)

{
  sexp_sint_t sVar1;
  sexp in_RCX;
  sexp in_RDX;
  int sign;
  sexp res;
  sexp in_stack_00000038;
  sexp in_stack_00000040;
  sexp in_stack_00000048;
  char local_2c;
  sexp local_28;
  
  if ((in_RDX->value).flonum_bits[0] == (in_RCX->value).flonum_bits[0]) {
    sVar1 = sexp_bignum_compare_abs(in_RDX,in_RCX);
    if (sVar1 < 0) {
      local_2c = -(in_RDX->value).flonum_bits[0];
    }
    else {
      local_2c = (in_RDX->value).flonum_bits[0];
    }
    local_28 = sexp_bignum_sub_digits(in_stack_00000038,ctx,dst,a);
  }
  else {
    local_2c = (in_RDX->value).flonum_bits[0];
    local_28 = sexp_bignum_add_digits(in_stack_00000048,in_stack_00000040,in_stack_00000038,ctx);
  }
  (local_28->value).flonum_bits[0] = local_2c;
  return local_28;
}

Assistant:

sexp sexp_bignum_sub (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp res;
  int sign;
  if (sexp_bignum_sign(a) == sexp_bignum_sign(b)) {
    sign = (sexp_bignum_compare_abs(a, b) >= 0 ? sexp_bignum_sign(a)
            : -sexp_bignum_sign(a));
    res = sexp_bignum_sub_digits(ctx, dst, a, b);
  } else {
    sign = sexp_bignum_sign(a);
    res = sexp_bignum_add_digits(ctx, dst, a, b);
  }
  sexp_bignum_sign(res) = sign;
  return res;
}